

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmp-tracking-gain-estimator.cpp
# Opt level: O2

void __thiscall
stateObservation::ZmpTrackingGainEstimator::resetWithMeasurements
          (ZmpTrackingGainEstimator *this,Vector2 *initZMP,Vector3 *initGain,Matrix2 *yaw,
          Vector2 *initZMPUncertainty,Vector3 *initGainUncertainty)

{
  LinearKalmanFilter *this_00;
  CommaInitializer<Eigen::Matrix<double,_5,_5,_0,_5,_5>_> *pCVar1;
  Vector5 x;
  Matrix5 P;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_3,_0,_2,_3>_>_>
  local_1d0 [16];
  CommaInitializer<Eigen::Matrix<double,_5,_5,_0,_5,_5>_> local_1c0;
  Matrix3 local_1a0;
  DenseBase<Eigen::Transpose<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_3,_0,_2,_3>_>_>_>
  local_158 [16];
  Matrix<double,_5,_1,_0,_5,_1> local_148;
  Matrix<double,_5,_5,_0,_5,_5> local_120;
  DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> local_58 [40];
  
  this_00 = &this->filter_;
  KalmanFilterBase::reset(&this_00->super_KalmanFilterBase);
  updateQ_(this);
  updateR_(this);
  Eigen::CommaInitializer<Eigen::Matrix<double,5,1,0,5,1>>::
  CommaInitializer<Eigen::Matrix<double,2,1,0,2,1>>
            ((CommaInitializer<Eigen::Matrix<double,5,1,0,5,1>> *)&local_120,&local_148,
             (DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)initZMP);
  Eigen::CommaInitializer<Eigen::Matrix<double,5,1,0,5,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,5,1,0,5,1>> *)&local_120,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)initGain);
  Eigen::CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_> *)&local_120);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Matrix<double,5,1,0,5,1>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_120,
             (DenseBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_> *)&local_148);
  ZeroDelayObserver::setState((ZeroDelayObserver *)this_00,(StateVector *)&local_120,0);
  free((void *)local_120.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.
               m_data.array[0]);
  Eigen::internal::call_assignment<Eigen::Matrix<double,2,2,0,2,2>,Eigen::Matrix<double,2,2,0,2,2>>
            (&this->yaw_,yaw);
  Vec2ToSqDiag_((Matrix2 *)local_58,initZMPUncertainty);
  Eigen::CommaInitializer<Eigen::Matrix<double,5,5,0,5,5>>::
  CommaInitializer<Eigen::Matrix<double,2,2,0,2,2>>
            ((CommaInitializer<Eigen::Matrix<double,5,5,0,5,5>> *)&local_1c0,&local_120,local_58);
  Eigen::DenseBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>::Zero();
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,5,5,0,5,5>>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,5,5,0,5,5>> *)&local_1c0,local_1d0);
  Eigen::DenseBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>::Zero();
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,5,5,0,5,5>>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,5,5,0,5,5>> *)pCVar1,local_158);
  Vec3ToSqDiag_(&local_1a0,initGainUncertainty);
  Eigen::CommaInitializer<Eigen::Matrix<double,5,5,0,5,5>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,5,5,0,5,5>> *)pCVar1,
             (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&local_1a0);
  Eigen::CommaInitializer<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>::finished(&local_1c0);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Matrix<double,5,5,0,5,5>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_1a0,
             (DenseBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_> *)&local_120);
  KalmanFilterBase::setStateCovariance(&this_00->super_KalmanFilterBase,(Pmatrix *)&local_1a0);
  free((void *)local_1a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[0]);
  return;
}

Assistant:

void ZmpTrackingGainEstimator::resetWithMeasurements(const Vector2 & initZMP,
                                                     const Vector3 & initGain,
                                                     const Matrix2 & yaw,
                                                     const Vector2 & initZMPUncertainty,
                                                     const Vector3 & initGainUncertainty)
{
  filter_.reset();
  updateQ_();
  updateR_();

  Vector5 x;
  x << initZMP, initGain;
  filter_.setState(x, 0);

  yaw_ = yaw;

  Matrix5 P;
  // clang-format off
  P << Vec2ToSqDiag_(initZMPUncertainty),  Matrix23::Zero(), 
       Matrix23::Zero().transpose(),       Vec3ToSqDiag_(initGainUncertainty);
  // clang-format on
  filter_.setStateCovariance(P);
}